

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player-properties.c
# Opt level: O1

void gain_spec_menu_browser(int oid,void *data,region_conflict *loc)

{
  player_ability *ppVar1;
  
  ppVar1 = lookup_ability("player",*(wchar_t *)(*data + (long)oid * 4),L'\0');
  text_out_hook = text_out_to_screen;
  text_out_wrap = L'<';
  text_out_indent = loc->col + L'\xffffffff';
  text_out_pad = L'\x01';
  clear_from(loc->page_rows + loc->row);
  Term_gotoxy(loc->col,loc->row + loc->page_rows + L'\x01');
  text_out_to_screen('\x1b',ppVar1->desc);
  text_out_pad = L'\0';
  text_out_indent = L'\0';
  text_out_wrap = L'\0';
  return;
}

Assistant:

static void gain_spec_menu_browser(int oid, void *data, const region *loc)
{
	struct spec_menu_data *d = data;
	int idx = d->specialties[oid];
	struct player_ability *ability = lookup_ability("player", idx, 0);

	/* Redirect output to the screen */
	text_out_hook = text_out_to_screen;
	text_out_wrap = 60;
	text_out_indent = loc->col - 1;
	text_out_pad = 1;


	clear_from(loc->row + loc->page_rows);
	Term_gotoxy(loc->col, loc->row + loc->page_rows + 1);
	text_out_to_screen(COLOUR_DEEP_L_BLUE, (char *) ability->desc);

	/* Reset */
	text_out_pad = 0;
	text_out_indent = 0;
	text_out_wrap = 0;
}